

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::StringData> *value)

{
  bool bVar1;
  StringData v;
  StringData local_48;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::value::StringData>::reset(value);
    bVar1 = true;
  }
  else {
    local_48.value._M_dataplus._M_p = (pointer)&local_48.value.field_2;
    local_48.value._M_string_length = 0;
    local_48.value.field_2._M_local_buf[0] = '\0';
    local_48.is_triple_quoted = false;
    local_48.single_quote = false;
    local_48.line_row = 0;
    local_48.line_col = 0;
    bVar1 = ReadBasicType(this,&local_48);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::StringData>::operator=(value,&local_48);
    }
    ::std::__cxx11::string::_M_dispose();
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::StringData> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::StringData v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}